

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

vector<uint256,_std::allocator<uint256>_> *
LocatorEntries(vector<uint256,_std::allocator<uint256>_> *__return_storage_ptr__,CBlockIndex *index)

{
  int iVar1;
  int height;
  long in_FS_OFFSET;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (index != (CBlockIndex *)0x0) {
    std::vector<uint256,_std::allocator<uint256>_>::reserve(__return_storage_ptr__,0x20);
    iVar1 = 1;
    while (index != (CBlockIndex *)0x0) {
      CBlockIndex::GetBlockHash(&local_50,index);
      std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                (__return_storage_ptr__,&local_50);
      if (index->nHeight == 0) break;
      height = index->nHeight - iVar1;
      if (height < 1) {
        height = 0;
      }
      index = CBlockIndex::GetAncestor(index,height);
      iVar1 = iVar1 << (0x140U < (ulong)((long)(__return_storage_ptr__->
                                               super__Vector_base<uint256,_std::allocator<uint256>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(__return_storage_ptr__->
                                              super__Vector_base<uint256,_std::allocator<uint256>_>)
                                              ._M_impl.super__Vector_impl_data._M_start));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint256> LocatorEntries(const CBlockIndex* index)
{
    int step = 1;
    std::vector<uint256> have;
    if (index == nullptr) return have;

    have.reserve(32);
    while (index) {
        have.emplace_back(index->GetBlockHash());
        if (index->nHeight == 0) break;
        // Exponentially larger steps back, plus the genesis block.
        int height = std::max(index->nHeight - step, 0);
        // Use skiplist.
        index = index->GetAncestor(height);
        if (have.size() > 10) step *= 2;
    }
    return have;
}